

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void algorithm_suite::copy_if_sequence(void)

{
  initializer_list<double> __l;
  value_type local_60;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> input;
  moment<double> filter;
  
  filter.member.mean = 1.0;
  filter.member.count = 0x4000000000000000;
  __l._M_len = 5;
  __l._M_array = (iterator)&filter;
  std::vector<double,_std::allocator<double>_>::vector(&input,__l,(allocator_type *)&local_60);
  filter.member.mean = 0.0;
  filter.member.count = 0;
  std::
  copy_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,trial::online::push_iterator<trial::online::cumulative::basic_moment<double,(trial::online::with)1>>,algorithm_suite::less_than<double>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish,&filter,(less_than<double>)0x4008000000000000);
  local_60 = (value_type)filter.member.count;
  local_58 = CONCAT44(local_58._4_4_,2);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2dd,"void algorithm_suite::copy_if_sequence()",&local_60,&local_58);
  local_60 = filter.member.mean;
  local_58 = 0x3ff8000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2de,"void algorithm_suite::copy_if_sequence()",&local_60,&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void copy_if_sequence()
{
    std::vector<double> input = { 1.0, 2.0, 3.0, 4.0, 5.0 };
    cumulative::moment<double> filter;
    std::copy_if(input.begin(), input.end(), push_inserter(filter), less_than<double>(3.0));
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.5);
}